

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_V5_MeshDoubleVertices::Read(ON_V5_MeshDoubleVertices *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  int major_version;
  int local_28 [2];
  
  this->m_fcount = 0;
  this->m_dcount = 0;
  this->m_fCRC = 0;
  this->m_dCRC = 0;
  ON_SimpleArray<ON_3dPoint>::Destroy(&(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>);
  local_28[0] = 0;
  local_28[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28 + 1,local_28);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_fcount);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_dcount), bVar1)) &&
        (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_fCRC), bVar1)) &&
       (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_dCRC), bVar1)) {
      bVar1 = ON_BinaryArchive::ReadArray(file,&(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_V5_MeshDoubleVertices::Read(ON_BinaryArchive& file)
{
  m_fcount = 0;
  m_dcount = 0;
  m_fCRC = 0;
  m_dCRC = 0;
  m_V5_dV.Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  for(;;)
  {
    rc = file.ReadInt(&m_fcount);
    if (!rc)
      break;
    rc = file.ReadInt(&m_dcount);
    if (!rc)
      break;
    rc = file.ReadInt(&m_fCRC);
    if (!rc)
      break;
    rc = file.ReadInt(&m_dCRC);
    if (!rc)
      break;
    rc = file.ReadArray(m_V5_dV);
    if (!rc)
      break;
    break;
  }
  if ( !file.EndRead3dmChunk() )
    rc = false;
    return rc;
}